

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmMakefile *pcVar5;
  pointer pcVar6;
  cmSourceFile *this_00;
  size_type sVar7;
  pointer ppcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  TargetType TVar12;
  int iVar13;
  string *psVar14;
  long *plVar15;
  undefined8 *puVar16;
  long *plVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pointer ppcVar18;
  undefined8 uVar19;
  byte bVar20;
  string *opt;
  char *pcVar21;
  _Alloc_hider _Var22;
  char *__end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string buildType;
  string linkLanguage;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  cmComputeLinkInformation *local_d8;
  string *local_d0;
  string local_c8;
  string local_a8;
  cmLinkLineComputer *local_88;
  string *local_80;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_78;
  cmOutputConverter *local_58;
  string local_50;
  
  local_80 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_f8,config);
  local_d0 = config;
  local_d8 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_88 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_c8,linkLineComputer,target,&local_f8);
  TVar12 = cmGeneratorTarget::GetType(target);
  switch(TVar12) {
  case EXECUTABLE:
    iVar13 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar13 != 0) {
      pcVar5 = this->Makefile;
      paVar2 = &local_158.field_2;
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"CMAKE_EXE_LINKER_FLAGS","");
      psVar14 = cmMakefile::GetSafeDefinition(pcVar5,&local_158);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar14->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      if (local_f8._M_string_length != 0) {
        local_158._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"CMAKE_EXE_LINKER_FLAGS_","");
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f8._M_dataplus._M_p);
        psVar14 = cmMakefile::GetSafeDefinition(this->Makefile,&local_158);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar14->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_c8._M_string_length == 0) {
        psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        std::operator+(&local_158,"CMake can not determine linker language for target: ",psVar14);
        cmSystemTools::Error(&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0030e173;
      }
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"WIN32_EXECUTABLE","");
      bVar9 = cmGeneratorTarget::GetPropertyAsBool(target,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = this->Makefile;
      if (bVar9) {
        local_158._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"CMAKE_CREATE_WIN32_EXE","");
        psVar14 = cmMakefile::GetSafeDefinition(pcVar5,&local_158);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar14->_M_dataplus)._M_p);
      }
      else {
        local_158._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"CMAKE_CREATE_CONSOLE_EXE","");
        psVar14 = cmMakefile::GetSafeDefinition(pcVar5,&local_158);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar14->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      bVar9 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar9) {
        local_158._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"CMAKE_EXE_EXPORTS_","");
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_c8._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_158);
        psVar14 = cmMakefile::GetSafeDefinition(this->Makefile,&local_158);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar14->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
    }
    AddLanguageFlagsForLinking(this,flags,target,&local_c8,&local_f8);
    if (local_d8 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_d8,local_88,local_80,frameworkPath,linkPath);
    }
    pcVar5 = this->Makefile;
    paVar2 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"BUILD_SHARED_LIBS","");
    pcVar21 = cmMakefile::GetDefinition(pcVar5,&local_158);
    bVar9 = cmSystemTools::IsOn(pcVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (bVar9) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_SHARED_BUILD_","");
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
      paVar3 = &local_138.field_2;
      plVar17 = plVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar17) {
        local_138.field_2._M_allocated_capacity = *plVar17;
        local_138.field_2._8_4_ = (undefined4)plVar15[3];
        local_138.field_2._12_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
        local_138._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_138.field_2._M_allocated_capacity = *plVar17;
        local_138._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_138._M_string_length = plVar15[1];
      *plVar15 = (long)plVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      paVar4 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"_FLAGS","");
      uVar19 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar3) {
        uVar19 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (undefined1 *)(local_138._M_string_length + local_118._M_string_length)) {
        uVar19 = (undefined1 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar4) {
          uVar19 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < (undefined1 *)(local_138._M_string_length + local_118._M_string_length))
        goto LAB_0030e48a;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_118,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
      }
      else {
LAB_0030e48a:
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_138,(ulong)local_118._M_dataplus._M_p);
      }
      psVar1 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_158.field_2._M_allocated_capacity = *psVar1;
        local_158.field_2._8_8_ = puVar16[3];
        local_158._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar1;
        local_158._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_158._M_string_length = puVar16[1];
      *puVar16 = psVar1;
      puVar16[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar4) {
        operator_delete(local_118._M_dataplus._M_p,
                        (ulong)(local_118.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar3) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      psVar14 = cmMakefile::GetSafeDefinition(this->Makefile,&local_158);
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar14->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    GetLinkLibsCMP0065(&local_158,this,&local_c8,target);
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_158._M_dataplus._M_p);
      std::__cxx11::string::append((char *)linkFlags);
    }
    paVar3 = &local_138.field_2;
    local_138._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"LINK_FLAGS","");
    pcVar21 = cmGeneratorTarget::GetProperty(target,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar3) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    if (pcVar21 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_f8._M_string_length != 0) {
      local_138._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8._M_dataplus._M_p);
      pcVar21 = cmGeneratorTarget::GetProperty(target,&local_138);
      if (pcVar21 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar3) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
    }
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_138,local_d0,&local_c8);
    sVar7 = local_138._M_string_length;
    for (_Var22._M_p = local_138._M_dataplus._M_p; _Var22._M_p != (pointer)sVar7;
        _Var22._M_p = _Var22._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,linkFlags,_Var22._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(this,linkFlags,&local_f8,&local_c8,target);
    break;
  case SHARED_LIBRARY:
    pcVar21 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_0030db9c;
  case MODULE_LIBRARY:
    pcVar21 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_0030db9c:
    iVar13 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar13 != 0) {
      pcVar5 = this->Makefile;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,pcVar21,pcVar21 + 0x19);
      cmMakefile::GetSafeDefinition(pcVar5,&local_158);
      std::__cxx11::string::_M_assign((string *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      if (local_f8._M_string_length != 0) {
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,pcVar21,pcVar21 + 0x19)
        ;
        std::__cxx11::string::append((char *)&local_158);
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f8._M_dataplus._M_p);
        psVar14 = cmMakefile::GetSafeDefinition(this->Makefile,&local_158);
        std::__cxx11::string::_M_append((char *)linkFlags,(ulong)(psVar14->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar5 = this->Makefile;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"WIN32","");
      bVar9 = cmMakefile::IsOn(pcVar5,&local_158);
      if (bVar9) {
        pcVar5 = this->Makefile;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CYGWIN","");
        bVar10 = cmMakefile::IsOn(pcVar5,&local_138);
        bVar11 = true;
        if (!bVar10) {
          pcVar5 = this->Makefile;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MINGW","");
          bVar11 = cmMakefile::IsOn(pcVar5,&local_a8);
        }
        bVar10 = !bVar10;
        bVar20 = bVar11 ^ 1;
      }
      else {
        bVar10 = false;
        bVar20 = 0;
      }
      if ((bVar10) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((bVar9) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2)) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (bVar20 != 0) {
        local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetSourceFiles(target,&local_78,&local_f8);
        pcVar5 = this->Makefile;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"CMAKE_LINK_DEF_FILE_FLAG","");
        psVar14 = cmMakefile::GetSafeDefinition(pcVar5,&local_118);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        pcVar6 = (psVar14->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar6,pcVar6 + psVar14->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          (ulong)(local_118.field_2._M_allocated_capacity + 1));
        }
        ppcVar8 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_58 = &this->super_cmOutputConverter;
          ppcVar18 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          do {
            this_00 = *ppcVar18;
            psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
            iVar13 = std::__cxx11::string::compare((char *)psVar14);
            if (iVar13 == 0) {
              std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_158._M_dataplus._M_p);
              psVar14 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
              cmsys::SystemTools::CollapseFullPath(&local_50,psVar14);
              cmOutputConverter::ConvertToOutputFormat(&local_118,local_58,&local_50,SHELL);
              std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_118._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                (ulong)(local_118.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)linkFlags);
            }
            ppcVar18 = ppcVar18 + 1;
          } while (ppcVar18 != ppcVar8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    paVar2 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"LINK_FLAGS","");
    pcVar21 = cmGeneratorTarget::GetProperty(target,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (pcVar21 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_f8._M_string_length != 0) {
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f8._M_dataplus._M_p);
      pcVar21 = cmGeneratorTarget::GetProperty(target,&local_158);
      if (pcVar21 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    local_158._M_dataplus._M_p = (pointer)0x0;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetLinkOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_158,local_d0,&local_c8);
    sVar7 = local_158._M_string_length;
    for (_Var22._M_p = local_158._M_dataplus._M_p; _Var22._M_p != (pointer)sVar7;
        _Var22._M_p = _Var22._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,linkFlags,_Var22._M_p);
    }
    if (local_d8 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_d8,local_88,local_80,frameworkPath,linkPath);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_158);
  }
  AppendPositionIndependentLinkerFlags(this,linkFlags,target,local_d0,&local_c8);
  AppendIPOLinkerFlags(this,linkFlags,target,local_d0,&local_c8);
LAB_0030e173:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      if (linkLanguage != "Swift") {
        linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = libraryLinkVariable;
          build += "_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (this->Makefile->IsOn("WIN32") &&
            !(this->Makefile->IsOn("CYGWIN") ||
              this->Makefile->IsOn("MINGW"))) {
          std::vector<cmSourceFile*> sources;
          target->GetSourceFiles(sources, buildType);
          std::string defFlag =
            this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
          for (cmSourceFile* sf : sources) {
            if (sf->GetExtension() == "def") {
              linkFlags += defFlag;
              linkFlags += this->ConvertToOutputFormat(
                cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
              linkFlags += " ";
            }
          }
        }
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      if (linkLanguage != "Swift") {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        linkFlags += " ";
        if (!buildType.empty()) {
          std::string build = "CMAKE_EXE_LINKER_FLAGS_";
          build += buildType;
          linkFlags += this->Makefile->GetSafeDefinition(build);
          linkFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
          linkFlags += " ";
        } else {
          linkFlags +=
            this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
          linkFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
          exportFlagVar += linkLanguage;
          exportFlagVar += "_FLAG";

          linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
          linkFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }

      std::vector<std::string> opts;
      target->GetLinkOptions(opts, config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, opts);
    } break;
    default:
      break;
  }

  this->AppendPositionIndependentLinkerFlags(linkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}